

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

uint __thiscall jpgd::jpeg_decoder::get_bits(jpeg_decoder *this,int num_bits)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint c2;
  uint c1;
  uint i;
  int num_bits_local;
  jpeg_decoder *this_local;
  
  if (num_bits == 0) {
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = (byte)num_bits;
    this_local._4_4_ = this->m_bit_buf >> (0x20 - bVar1 & 0x1f);
    iVar2 = this->m_bits_left - num_bits;
    this->m_bits_left = iVar2;
    if (iVar2 < 1) {
      this->m_bit_buf = this->m_bit_buf << ((char)this->m_bits_left + bVar1 & 0x1f);
      uVar3 = get_char(this);
      uVar4 = get_char(this);
      this->m_bit_buf = this->m_bit_buf & 0xffff0000 | uVar3 << 8 | uVar4;
      this->m_bit_buf = this->m_bit_buf << (-(char)this->m_bits_left & 0x1fU);
      this->m_bits_left = this->m_bits_left + 0x10;
      if (this->m_bits_left < 0) {
        __assert_fail("m_bits_left >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x1dc,"uint jpgd::jpeg_decoder::get_bits(int)");
      }
    }
    else {
      this->m_bit_buf = this->m_bit_buf << (bVar1 & 0x1f);
    }
  }
  return this_local._4_4_;
}

Assistant:

inline uint jpeg_decoder::get_bits(int num_bits)
	{
		if (!num_bits)
			return 0;

		uint i = m_bit_buf >> (32 - num_bits);

		if ((m_bits_left -= num_bits) <= 0)
		{
			m_bit_buf <<= (num_bits += m_bits_left);

			uint c1 = get_char();
			uint c2 = get_char();
			m_bit_buf = (m_bit_buf & 0xFFFF0000) | (c1 << 8) | c2;

			m_bit_buf <<= -m_bits_left;

			m_bits_left += 16;

			assert(m_bits_left >= 0);
		}
		else
			m_bit_buf <<= num_bits;

		return i;
	}